

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

result_type __thiscall
math::wide_integer::uniform_int_distribution<128u,unsigned_int,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<128u,unsigned_int,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  unsigned_fast_type uVar1;
  bool bVar2;
  uint uVar3;
  array<unsigned_int,_4UL> *paVar4;
  iterator puVar5;
  long lVar6;
  undefined5 extraout_var;
  undefined5 extraout_var_00;
  undefined5 extraout_var_01;
  undefined5 extraout_var_02;
  undefined5 extraout_var_03;
  undefined5 extraout_var_04;
  bool local_e5;
  uintwide_t<128U,_unsigned_int,_void,_false> local_d8;
  uintwide_t<128U,_unsigned_int,_void,_false> local_c8;
  uintwide_t<128U,_unsigned_int,_void,_false> local_b8;
  undefined1 local_a8 [8];
  result_type range;
  representation_type local_98;
  uintwide_t<128U,_unsigned_int,_void,_false> local_88;
  uintwide_t<128U,_unsigned_int,_void,_false> local_78;
  uintwide_t<128U,_unsigned_int,_void,_false> local_68;
  undefined1 local_55;
  undefined4 local_54;
  uint8_t next_byte;
  ulong uStack_50;
  uint right_shift_amount;
  unsigned_fast_type j;
  iterator it;
  generator_result_type value;
  uint32_t digits_gtor_ratio;
  uint32_t digits_limb_ratio;
  uint32_t digits_generator_result_type;
  param_type *input_params_local;
  linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator_local;
  uniform_int_distribution<24U,_unsigned_char,_void,_false> *this_local;
  result_type result;
  
  _digits_limb_ratio = (param_type *)input_params;
  input_params_local = (param_type *)input_generator;
  input_generator_local = (linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)this;
  uintwide_t<128u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
  enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std::
  numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::digits),void>::type__
            (&this_local,'\0',
             (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  digits_gtor_ratio = 0x20;
  value = 4;
  it._4_4_ = 4;
  it._0_4_ = 0;
  paVar4 = (array<unsigned_int,_4UL> *)
           uintwide_t<128U,_unsigned_int,_void,_false>::representation
                     ((uintwide_t<128U,_unsigned_int,_void,_false> *)&this_local);
  j = (unsigned_fast_type)detail::array_detail::array<unsigned_int,_4UL>::begin(paVar4);
  uStack_50 = 0;
  while( true ) {
    uVar1 = j;
    paVar4 = (array<unsigned_int,_4UL> *)
             uintwide_t<128U,_unsigned_int,_void,_false>::representation
                       ((uintwide_t<128U,_unsigned_int,_void,_false> *)&this_local);
    puVar5 = detail::array_detail::array<unsigned_int,_4UL>::end(paVar4);
    if ((iterator)uVar1 == puVar5) break;
    if ((uStack_50 & 3) == 0) {
      it._0_4_ = std::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::operator()
                           ((linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *)
                            input_params_local);
    }
    lVar6 = (uStack_50 & 3) << 3;
    local_54 = (undefined4)lVar6;
    uVar3 = (result_type)it >> (sbyte)lVar6;
    local_55 = (undefined1)uVar3;
    *(uint *)j = *(uint *)j | (uVar3 & 0xff) << (sbyte)((uStack_50 & 3) << 3);
    uStack_50 = uStack_50 + 1;
    if ((uStack_50 & 3) == 0) {
      j = j + 4;
    }
  }
  local_68.values.super_array<unsigned_int,_4UL>.elems[0]._0_3_ =
       uniform_int_distribution<128U,_unsigned_int,_void,_false>::param_type::get_a
                 (_digits_limb_ratio);
  local_68.values.super_array<unsigned_int,_4UL>.elems._3_5_ = extraout_var;
  local_78.values.super_array<unsigned_int,_4UL>.elems[0]._0_3_ =
       numeric_limits_uintwide_t_base<128U,_unsigned_int,_void,_false>::min();
  local_78.values.super_array<unsigned_int,_4UL>.elems._3_5_ = extraout_var_00;
  bVar2 = uintwide_t<128U,_unsigned_int,_void,_false>::operator!=(&local_68,&local_78);
  local_e5 = true;
  if (!bVar2) {
    local_88.values.super_array<unsigned_int,_4UL>.elems[0]._0_3_ =
         uniform_int_distribution<128U,_unsigned_int,_void,_false>::param_type::get_b
                   (_digits_limb_ratio);
    local_88.values.super_array<unsigned_int,_4UL>.elems._3_5_ = extraout_var_01;
    local_98.super_array<unsigned_int,_4UL>.elems =
         (array<unsigned_int,_4UL>)
         numeric_limits_uintwide_t_base<128U,_unsigned_int,_void,_false>::max();
    local_e5 = uintwide_t<128U,_unsigned_int,_void,_false>::operator!=
                         (&local_88,(uintwide_t<128U,_unsigned_int,_void,_false> *)&local_98);
  }
  if (local_e5 != false) {
    local_b8.values.super_array<unsigned_int,_4UL>.elems[0]._0_3_ =
         uniform_int_distribution<128U,_unsigned_int,_void,_false>::param_type::get_b
                   (_digits_limb_ratio);
    local_b8.values.super_array<unsigned_int,_4UL>.elems._3_5_ = extraout_var_02;
    local_c8.values.super_array<unsigned_int,_4UL>.elems[0]._0_3_ =
         uniform_int_distribution<128U,_unsigned_int,_void,_false>::param_type::get_a
                   (_digits_limb_ratio);
    local_c8.values.super_array<unsigned_int,_4UL>.elems._3_5_ = extraout_var_03;
    _local_a8 = (value_type_conflict  [4])wide_integer::operator-(&local_b8,&local_c8);
    uintwide_t<128U,_unsigned_int,_void,_false>::operator++
              ((uintwide_t<128U,_unsigned_int,_void,_false> *)local_a8);
    uintwide_t<128U,_unsigned_int,_void,_false>::operator%=
              ((uintwide_t<128U,_unsigned_int,_void,_false> *)&this_local,
               (uintwide_t<24U,_unsigned_char,_void,_false> *)local_a8);
    local_d8.values.super_array<unsigned_int,_4UL>.elems[0]._0_3_ =
         uniform_int_distribution<128U,_unsigned_int,_void,_false>::param_type::get_a
                   (_digits_limb_ratio);
    local_d8.values.super_array<unsigned_int,_4UL>.elems._3_5_ = extraout_var_04;
    uintwide_t<128U,_unsigned_int,_void,_false>::operator+=
              ((uintwide_t<128U,_unsigned_int,_void,_false> *)&this_local,&local_d8);
  }
  return (result_type)SUB83(this_local,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }